

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void duckdb::RLEFilter<short>
               (ColumnSegment *segment,ColumnScanState *state,idx_t vector_count,Vector *result,
               SelectionVector *sel,idx_t *sel_count,TableFilter *filter,
               TableFilterState *filter_state)

{
  bool bVar1;
  RLEScanState<short> *this;
  idx_t iVar2;
  pointer __s;
  type pbVar3;
  short *psVar4;
  ulong uVar5;
  ulong uVar6;
  InternalException *this_00;
  Vector *in_RCX;
  ColumnSegment *in_RDI;
  SelectionVector *in_R8;
  ulong *in_R9;
  idx_t read_idx;
  idx_t i_3;
  idx_t prev_idx;
  idx_t i_2;
  idx_t i_1;
  short element;
  idx_t remaining_scan_count;
  idx_t run_count;
  rle_count_t run_end;
  idx_t result_end;
  idx_t result_offset;
  SelectionVector matching_sel;
  idx_t matching_count;
  short *result_data;
  idx_t idx;
  idx_t i;
  SelectionVector run_matches;
  UnifiedVectorFormat run_format;
  Vector run_vector;
  unsigned_long total_run_count;
  rle_count_t *index_pointer;
  short *data_pointer;
  data_ptr_t data;
  RLEScanState<short> *scan_state;
  idx_t in_stack_00000250;
  TableFilterState *in_stack_00000258;
  TableFilter *in_stack_00000260;
  UnifiedVectorFormat *in_stack_00000268;
  Vector *in_stack_00000270;
  SelectionVector *in_stack_00000278;
  idx_t *in_stack_00000290;
  string *in_stack_fffffffffffffdc8;
  Vector *in_stack_fffffffffffffdd0;
  idx_t in_stack_fffffffffffffdd8;
  allocator *paVar7;
  UnifiedVectorFormat *in_stack_fffffffffffffde0;
  rle_count_t *in_stack_fffffffffffffde8;
  allocator in_stack_fffffffffffffdff;
  Vector *in_stack_fffffffffffffe00;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  data_ptr_t in_stack_fffffffffffffe40;
  ulong uVar8;
  undefined6 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4e;
  short sVar9;
  Vector *in_stack_fffffffffffffe50;
  ulong local_190;
  UnifiedVectorFormat *in_stack_fffffffffffffe90;
  ulong uVar10;
  idx_t in_stack_fffffffffffffe98;
  Vector *in_stack_fffffffffffffea0;
  ulong local_158;
  SelectionVector local_150 [10];
  UnifiedVectorFormat local_60;
  ColumnSegment *local_8;
  
  local_60.owned_sel.sel_vector = (sel_t *)in_R9;
  local_60.owned_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_R8;
  local_60.owned_sel.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RCX;
  local_8 = in_RDI;
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_fffffffffffffdd0);
  local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity =
       (idx_t)SegmentScanState::Cast<duckdb::RLEScanState<short>>
                        ((SegmentScanState *)in_stack_fffffffffffffdd0);
  this = (RLEScanState<short> *)BufferHandle::Ptr((BufferHandle *)0xa47889);
  iVar2 = ColumnSegment::GetBlockOffset(local_8);
  local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       ((long)&(this->super_SegmentScanState)._vptr_SegmentScanState + iVar2);
  local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           &(local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi)->_M_use_count;
  local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)
       ((long)&(local_60.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_vptr__Sp_counted_base +
       (ulong)*(uint32_t *)
               (local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x30));
  local_60.data =
       (data_ptr_t)
       ((ulong)*(uint32_t *)
                (local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x30) - 8
       >> 1);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)0xa4790b);
  if (!bVar1) {
    in_stack_fffffffffffffde0 = &local_60;
    make_unsafe_uniq_array<bool>((size_t)in_stack_fffffffffffffde8);
    unique_ptr<bool[],_std::default_delete<bool>,_false>::operator=
              ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)in_stack_fffffffffffffdd0,
               (unique_ptr<bool[],_std::default_delete<bool>,_false> *)in_stack_fffffffffffffdc8);
    unique_ptr<bool[],_std::default_delete<bool>,_false>::~unique_ptr
              ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)0xa4794d);
    __s = ::std::unique_ptr<bool[],_std::default_delete<bool[]>_>::get
                    ((unique_ptr<bool[],_std::default_delete<bool[]>_> *)in_stack_fffffffffffffdd0);
    memset(__s,0,(size_t)local_60.data);
    Vector::GetType((Vector *)
                    local_60.owned_sel.selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
    LogicalType::LogicalType
              ((LogicalType *)in_stack_fffffffffffffdd0,(LogicalType *)in_stack_fffffffffffffdc8);
    in_stack_fffffffffffffde8 =
         (rle_count_t *)
         data_ptr_cast<short>
                   ((short *)local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                             validity_data.internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
    Vector::Vector(in_stack_fffffffffffffe50,
                   (LogicalType *)CONCAT26(in_stack_fffffffffffffe4e,in_stack_fffffffffffffe48),
                   in_stack_fffffffffffffe40);
    LogicalType::~LogicalType((LogicalType *)0xa479ca);
    UnifiedVectorFormat::UnifiedVectorFormat(in_stack_fffffffffffffde0);
    Vector::ToUnifiedFormat
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    SelectionVector::SelectionVector((SelectionVector *)0xa47a05);
    *(data_ptr_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x40) =
         local_60.data;
    in_stack_fffffffffffffdc8 =
         (string *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x40);
    ColumnSegment::FilterSelection
              (in_stack_00000278,in_stack_00000270,in_stack_00000268,in_stack_00000260,
               in_stack_00000258,in_stack_00000250,in_stack_00000290);
    for (local_158 = 0;
        local_158 <
        *(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x40);
        local_158 = local_158 + 1) {
      SelectionVector::get_index(local_150,local_158);
      pbVar3 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                         ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                          in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
      *pbVar3 = true;
    }
    SelectionVector::~SelectionVector((SelectionVector *)0xa47b5b);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffdd0);
    Vector::~Vector(in_stack_fffffffffffffdd0);
  }
  if (*(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x40) == 0)
  {
    local_60.owned_sel.sel_vector[0] = 0;
    local_60.owned_sel.sel_vector[1] = 0;
  }
  else {
    psVar4 = FlatVector::GetData<short>((Vector *)0xa47bc6);
    Vector::SetVectorType(in_stack_fffffffffffffe00,(VectorType)in_stack_fffffffffffffdff);
    uVar10 = 0;
    SelectionVector::SelectionVector((SelectionVector *)this,(idx_t)in_stack_fffffffffffffde8);
    bVar1 = SelectionVector::IsSet
                      ((SelectionVector *)
                       local_60.owned_sel.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
    ;
    if (!bVar1) {
      local_190 = 0;
      uVar8 = *(ulong *)local_60.owned_sel.sel_vector;
LAB_00a47c35:
      if (local_190 < uVar8) {
        uVar5 = (ulong)*(ushort *)
                        ((long)local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask +
                        *(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                                   capacity + 0x20) * 2) -
                *(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity +
                          0x28);
        uVar6 = uVar8 - local_190;
        sVar9 = *(short *)((long)local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                                 validity_data.internal.
                                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr +
                          *(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                                     capacity + 0x20) * 2);
        if (uVar5 <= uVar6) goto LAB_00a47d90;
        pbVar3 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                           ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                            in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
        if ((*pbVar3 & 1U) != 0) {
          for (uVar8 = 0; uVar8 < uVar6; uVar8 = uVar8 + 1) {
            psVar4[local_190 + uVar8] = sVar9;
            uVar10 = uVar10 + 1;
            SelectionVector::set_index
                      ((SelectionVector *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                       (idx_t)in_stack_fffffffffffffdd0);
          }
        }
        *(ulong *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity + 0x28) =
             uVar6 + *(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                                capacity + 0x28);
      }
      goto LAB_00a48051;
    }
    local_1d0 = 0;
    for (local_1d8 = 0; local_1d8 < *(ulong *)local_60.owned_sel.sel_vector;
        local_1d8 = local_1d8 + 1) {
      iVar2 = SelectionVector::get_index
                        ((SelectionVector *)
                         local_60.owned_sel.selection_data.internal.
                         super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr,local_1d8);
      if (iVar2 < local_1d0) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        paVar7 = (allocator *)&stack0xfffffffffffffdff;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&stack0xfffffffffffffe00,
                   "Error in RLEFilter - selection vector indices are not ordered",paVar7);
        InternalException::InternalException(this_00,in_stack_fffffffffffffdc8);
        __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
      }
      RLEScanState<short>::SkipInternal
                (this,in_stack_fffffffffffffde8,(idx_t)in_stack_fffffffffffffde0);
      pbVar3 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                         ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                          in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
      if ((*pbVar3 & 1U) != 0) {
        psVar4[iVar2] =
             *(short *)((long)local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                              validity_data.internal.
                              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr +
                       *(idx_t *)(local_60.validity.super_TemplatedValidityMask<unsigned_long>.
                                  capacity + 0x20) * 2);
        uVar10 = uVar10 + 1;
        SelectionVector::set_index
                  ((SelectionVector *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                   (idx_t)in_stack_fffffffffffffdd0);
      }
      local_1d0 = iVar2;
    }
    RLEScanState<short>::SkipInternal
              (this,in_stack_fffffffffffffde8,(idx_t)in_stack_fffffffffffffde0);
LAB_00a48051:
    if (uVar10 != *(ulong *)local_60.owned_sel.sel_vector) {
      SelectionVector::Initialize
                ((SelectionVector *)in_stack_fffffffffffffdd0,
                 (SelectionVector *)in_stack_fffffffffffffdc8);
      *(ulong *)local_60.owned_sel.sel_vector = uVar10;
    }
    SelectionVector::~SelectionVector((SelectionVector *)0xa4809b);
  }
  return;
LAB_00a47d90:
  pbVar3 = unique_ptr<bool[],_std::default_delete<bool>,_false>::operator[]
                     ((unique_ptr<bool[],_std::default_delete<bool>,_false> *)
                      in_stack_fffffffffffffdd0,(size_t)in_stack_fffffffffffffdc8);
  if ((*pbVar3 & 1U) != 0) {
    for (local_1c8 = 0; local_1c8 < uVar5; local_1c8 = local_1c8 + 1) {
      psVar4[local_190 + local_1c8] = sVar9;
      uVar10 = uVar10 + 1;
      SelectionVector::set_index
                ((SelectionVector *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                 (idx_t)in_stack_fffffffffffffdd0);
    }
  }
  local_190 = uVar5 + local_190;
  RLEScanState<short>::ForwardToNextRun
            ((RLEScanState<short> *)
             local_60.validity.super_TemplatedValidityMask<unsigned_long>.capacity);
  goto LAB_00a47c35;
}

Assistant:

void RLEFilter(ColumnSegment &segment, ColumnScanState &state, idx_t vector_count, Vector &result, SelectionVector &sel,
               idx_t &sel_count, const TableFilter &filter, TableFilterState &filter_state) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	auto total_run_count = (scan_state.rle_count_offset - RLEConstants::RLE_HEADER_SIZE) / sizeof(T);
	if (!scan_state.matching_runs) {
		// we haven't applied the filter yet
		// apply the filter to all RLE values at once

		// initialize the filter set to all false (all runs are filtered out)
		scan_state.matching_runs = make_unsafe_uniq_array<bool>(total_run_count);
		memset(scan_state.matching_runs.get(), 0, sizeof(bool) * total_run_count);

		// execute the filter over all runs at once
		Vector run_vector(result.GetType(), data_ptr_cast(data_pointer));

		UnifiedVectorFormat run_format;
		run_vector.ToUnifiedFormat(total_run_count, run_format);

		SelectionVector run_matches;
		scan_state.matching_run_count = total_run_count;
		ColumnSegment::FilterSelection(run_matches, run_vector, run_format, filter, filter_state, total_run_count,
		                               scan_state.matching_run_count);

		// for any runs that pass the filter - set the matches to true
		for (idx_t i = 0; i < scan_state.matching_run_count; i++) {
			auto idx = run_matches.get_index(i);
			scan_state.matching_runs[idx] = true;
		}
	}
	if (scan_state.matching_run_count == 0) {
		// early-out, no runs match the filter so the filter can never pass
		sel_count = 0;
		return;
	}
	// scan (the subset of) the matching runs AND set the output selection vector with the rows that match
	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t matching_count = 0;
	SelectionVector matching_sel(sel_count);
	if (!sel.IsSet()) {
		// no selection vector yet - fast path
		// this is essentially the normal scan, but we apply the filter and fill the selection vector
		idx_t result_offset = 0;
		idx_t result_end = sel_count;
		while (result_offset < result_end) {
			rle_count_t run_end = index_pointer[scan_state.entry_pos];
			idx_t run_count = run_end - scan_state.position_in_entry;
			idx_t remaining_scan_count = result_end - result_offset;
			// the run is scanned - scan it
			T element = data_pointer[scan_state.entry_pos];
			if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
				if (scan_state.matching_runs[scan_state.entry_pos]) {
					for (idx_t i = 0; i < remaining_scan_count; i++) {
						result_data[result_offset + i] = element;
						matching_sel.set_index(matching_count++, result_offset + i);
					}
				}
				scan_state.position_in_entry += remaining_scan_count;
				break;
			}

			if (scan_state.matching_runs[scan_state.entry_pos]) {
				for (idx_t i = 0; i < run_count; i++) {
					result_data[result_offset + i] = element;
					matching_sel.set_index(matching_count++, result_offset + i);
				}
			}

			result_offset += run_count;
			scan_state.ForwardToNextRun();
		}
	} else {
		// we already have a selection applied - this is more complex since we need to merge it with our filter
		// use a simpler (but slower) approach
		idx_t prev_idx = 0;
		for (idx_t i = 0; i < sel_count; i++) {
			auto read_idx = sel.get_index(i);
			if (read_idx < prev_idx) {
				throw InternalException("Error in RLEFilter - selection vector indices are not ordered");
			}
			// skip forward to the next index
			scan_state.SkipInternal(index_pointer, read_idx - prev_idx);
			prev_idx = read_idx;
			if (!scan_state.matching_runs[scan_state.entry_pos]) {
				// this run is filtered out - we don't need to scan it
				continue;
			}
			// the run is not filtered out - read the element
			result_data[read_idx] = data_pointer[scan_state.entry_pos];
			matching_sel.set_index(matching_count++, read_idx);
		}
		// skip the tail
		scan_state.SkipInternal(index_pointer, vector_count - prev_idx);
	}

	// set up the filter result
	if (matching_count != sel_count) {
		sel.Initialize(matching_sel);
		sel_count = matching_count;
	}
}